

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qthreadpool.cpp
# Opt level: O2

void QThreadPool::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  Priority *pPVar1;
  Priority PVar2;
  
  if (_c == WriteProperty) {
    if ((uint)_id < 5) {
      pPVar1 = (Priority *)*_a;
      switch(_id) {
      case 0:
        setExpiryTimeout((QThreadPool *)_o,*pPVar1);
        return;
      case 1:
        setMaxThreadCount((QThreadPool *)_o,*pPVar1);
        return;
      case 3:
        setStackSize((QThreadPool *)_o,*pPVar1);
        return;
      case 4:
        setThreadPriority((QThreadPool *)_o,*pPVar1);
        return;
      }
    }
  }
  else if ((_c == ReadProperty) && ((uint)_id < 5)) {
    pPVar1 = (Priority *)*_a;
    switch(_id) {
    case 0:
      PVar2 = expiryTimeout((QThreadPool *)_o);
      break;
    case 1:
      PVar2 = maxThreadCount((QThreadPool *)_o);
      break;
    case 2:
      PVar2 = activeThreadCount((QThreadPool *)_o);
      break;
    case 3:
      PVar2 = stackSize((QThreadPool *)_o);
      break;
    case 4:
      PVar2 = threadPriority((QThreadPool *)_o);
    }
    *pPVar1 = PVar2;
  }
  return;
}

Assistant:

void QThreadPool::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QThreadPool *>(_o);
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<int*>(_v) = _t->expiryTimeout(); break;
        case 1: *reinterpret_cast<int*>(_v) = _t->maxThreadCount(); break;
        case 2: *reinterpret_cast<int*>(_v) = _t->activeThreadCount(); break;
        case 3: *reinterpret_cast<uint*>(_v) = _t->stackSize(); break;
        case 4: *reinterpret_cast<QThread::Priority*>(_v) = _t->threadPriority(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setExpiryTimeout(*reinterpret_cast<int*>(_v)); break;
        case 1: _t->setMaxThreadCount(*reinterpret_cast<int*>(_v)); break;
        case 3: _t->setStackSize(*reinterpret_cast<uint*>(_v)); break;
        case 4: _t->setThreadPriority(*reinterpret_cast<QThread::Priority*>(_v)); break;
        default: break;
        }
    }
}